

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_record.cc
# Opt level: O1

RM_Record * __thiscall RM_Record::operator=(RM_Record *this,RM_Record *record)

{
  int iVar1;
  char *__dest;
  int iVar2;
  
  if (this != record) {
    if (this->data != (char *)0x0) {
      operator_delete__(this->data);
    }
    iVar1 = record->size;
    this->size = iVar1;
    iVar2 = -1;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    __dest = (char *)operator_new__((long)iVar2);
    this->data = __dest;
    memcpy(__dest,record->data,(long)record->size);
    RID::operator=(&this->rid,&record->rid);
  }
  return this;
}

Assistant:

RM_Record& RM_Record::operator= (const RM_Record &record){
  if (this != &record){
    if(this->data != NULL)  // make sure the memory allocation is for the
      delete [] data;       // correct size of the record
    this->size = record.size;
    this->data = new char[size];
    memcpy(this->data, record.data, record.size);
    this->rid = record.rid;
  }
  return (*this);
}